

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O1

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  Allocator *pAVar4;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  void *__src;
  int iVar11;
  Mat *pMVar12;
  void *pvVar13;
  int _woffset;
  int _hoffset;
  Mat *local_130;
  int local_124;
  int _outc;
  int _outw;
  Mat bottom_blob_sliced;
  int _outh;
  size_t local_d0;
  Mat m;
  int _coffset;
  Mat borderm;
  
  iVar7 = bottom_blob->w;
  iVar11 = bottom_blob->h;
  local_124 = bottom_blob->c;
  iVar1 = bottom_blob->dims;
  if (iVar1 == 3) {
    bottom_blob_sliced.w = iVar7;
    bottom_blob_sliced.dims = 3;
    bottom_blob_sliced.c = bottom_blob->elempack * local_124;
    bottom_blob_sliced.h = iVar11;
    bottom_blob_sliced.cstep = (long)(iVar11 * iVar7) + 3U & 0x3ffffffffffffffc;
LAB_001363ad:
    bottom_blob_sliced.elempack = 1;
    bottom_blob_sliced.elemsize._0_4_ = 4;
  }
  else if (iVar1 == 2) {
    bottom_blob_sliced.h = bottom_blob->elempack * iVar11;
    bottom_blob_sliced.elemsize._0_4_ = 4;
    bottom_blob_sliced.elempack = 1;
    bottom_blob_sliced.w = iVar7;
    bottom_blob_sliced.dims = 2;
    bottom_blob_sliced.c = 1;
    bottom_blob_sliced.cstep = (size_t)(bottom_blob_sliced.h * iVar7);
  }
  else {
    if (iVar1 == 1) {
      bottom_blob_sliced.cstep = (long)bottom_blob->elempack * (long)iVar7;
      bottom_blob_sliced.w = (int)bottom_blob_sliced.cstep;
      bottom_blob_sliced.dims = 1;
      bottom_blob_sliced.h = 1;
      bottom_blob_sliced.c = 1;
      goto LAB_001363ad;
    }
    bottom_blob_sliced.elemsize._0_4_ = 0;
    bottom_blob_sliced.elempack = 0;
    bottom_blob_sliced.dims = 0;
    bottom_blob_sliced.w = 0;
    bottom_blob_sliced.h = 0;
    bottom_blob_sliced.c = 0;
    bottom_blob_sliced.cstep = 0;
  }
  bottom_blob_sliced.elemsize._4_4_ = 0;
  bottom_blob_sliced.refcount._4_4_ = 0;
  bottom_blob_sliced.refcount._0_4_ = 0;
  bottom_blob_sliced.allocator = (Allocator *)0x0;
  bottom_blob_sliced.data = (void *)0x0;
  local_d0 = bottom_blob->elemsize;
  local_130 = top_blob;
  resolve_crop_roi(this,&bottom_blob_sliced,&_woffset,&_hoffset,&_coffset,&_outw,&_outh,&_outc);
  piVar3 = (int *)CONCAT44(bottom_blob_sliced.refcount._4_4_,bottom_blob_sliced.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (bottom_blob_sliced.allocator == (Allocator *)0x0) {
        if (bottom_blob_sliced.data != (void *)0x0) {
          free(bottom_blob_sliced.data);
        }
      }
      else {
        (**(code **)(*(long *)bottom_blob_sliced.allocator + 0x18))();
      }
    }
  }
  sVar10 = local_d0;
  pMVar12 = local_130;
  if (iVar1 == 3) {
    if (_outc != local_124 || (iVar11 != _outh || iVar7 != _outw)) {
      bottom_blob_sliced.w = bottom_blob->w;
      bottom_blob_sliced.h = bottom_blob->h;
      uVar6 = bottom_blob->elemsize;
      bottom_blob_sliced.data =
           (void *)((long)_coffset * bottom_blob->cstep * uVar6 + (long)bottom_blob->data);
      bottom_blob_sliced.elempack = bottom_blob->elempack;
      bottom_blob_sliced.allocator = bottom_blob->allocator;
      bottom_blob_sliced.refcount._0_4_ = 0;
      bottom_blob_sliced.refcount._4_4_ = 0;
      bottom_blob_sliced.elemsize._0_4_ = (undefined4)uVar6;
      bottom_blob_sliced.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
      bottom_blob_sliced.dims = 3;
      bottom_blob_sliced.c = _outc;
      bottom_blob_sliced.cstep =
           ((long)(bottom_blob_sliced.h * bottom_blob_sliced.w) * uVar6 + 0xf & 0xfffffffffffffff0)
           / uVar6;
      if (iVar11 != _outh || iVar7 != _outw) {
        Mat::create(local_130,_outw,_outh,_outc,local_d0,opt->blob_allocator);
        iVar7 = -100;
        if ((pMVar12->data != (void *)0x0) && ((long)pMVar12->c * pMVar12->cstep != 0)) {
          if (0 < _outc) {
            lVar8 = 0;
            do {
              m.data = (void *)(bottom_blob_sliced.cstep * lVar8 *
                                CONCAT44(bottom_blob_sliced.elemsize._4_4_,
                                         (undefined4)bottom_blob_sliced.elemsize) +
                               (long)bottom_blob_sliced.data);
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = (undefined4)bottom_blob_sliced.elemsize;
              m.elemsize._4_4_ = bottom_blob_sliced.elemsize._4_4_;
              m.elempack = bottom_blob_sliced.elempack;
              m.allocator = bottom_blob_sliced.allocator;
              m.w = bottom_blob_sliced.w;
              m.dims = 2;
              m.c = 1;
              m.h = bottom_blob_sliced.h;
              m.cstep = (size_t)(bottom_blob_sliced.h * bottom_blob_sliced.w);
              uVar2 = pMVar12->w;
              iVar7 = pMVar12->h;
              sVar5 = pMVar12->elemsize;
              pvVar13 = (void *)(pMVar12->cstep * lVar8 * sVar5 + (long)pMVar12->data);
              borderm.elempack = pMVar12->elempack;
              borderm.allocator = pMVar12->allocator;
              borderm.refcount._0_4_ = 0;
              borderm.refcount._4_4_ = 0;
              borderm.elemsize._0_4_ = (undefined4)sVar5;
              borderm.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
              borderm.w = uVar2;
              borderm.dims = 2;
              borderm.c = 1;
              borderm.h = iVar7;
              borderm.cstep = (size_t)(int)(iVar7 * uVar2);
              borderm.data = pvVar13;
              if (sVar10 == 4) {
LAB_001369bd:
                copy_cut_border_image<float>(&m,&borderm,_hoffset,_woffset);
              }
              else if (sVar10 == 2) {
LAB_0013699e:
                copy_cut_border_image<unsigned_short>(&m,&borderm,_hoffset,_woffset);
                if (sVar10 == 4) goto LAB_001369bd;
              }
              else if (sVar10 == 1) {
                if (0 < iVar7) {
                  __src = (void *)((long)m.data +
                                  CONCAT44(bottom_blob_sliced.elemsize._4_4_,
                                           (undefined4)bottom_blob_sliced.elemsize) *
                                  (long)_hoffset * (long)bottom_blob_sliced.w + (long)_woffset);
                  lVar9 = (long)bottom_blob_sliced.w;
                  iVar11 = 0;
                  local_124 = iVar7;
                  do {
                    if ((int)uVar2 < 0xc) {
                      if (0 < (int)uVar2) {
                        uVar6 = 0;
                        do {
                          *(undefined1 *)((long)pvVar13 + uVar6) =
                               *(undefined1 *)((long)__src + uVar6);
                          uVar6 = uVar6 + 1;
                        } while (uVar2 != uVar6);
                      }
                    }
                    else {
                      memcpy(pvVar13,__src,(ulong)uVar2);
                      iVar7 = local_124;
                    }
                    pvVar13 = (void *)((long)pvVar13 + (long)(int)uVar2);
                    __src = (void *)((long)__src + lVar9);
                    iVar11 = iVar11 + 1;
                  } while (iVar11 != iVar7);
                }
                sVar10 = local_d0;
                pMVar12 = local_130;
                if (local_d0 == 4) goto LAB_001369bd;
                if (local_d0 == 2) goto LAB_0013699e;
              }
              piVar3 = (int *)CONCAT44(borderm.refcount._4_4_,borderm.refcount._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (borderm.allocator == (Allocator *)0x0) {
                    if (borderm.data != (void *)0x0) {
                      free(borderm.data);
                    }
                  }
                  else {
                    (**(code **)(*(long *)borderm.allocator + 0x18))();
                  }
                }
              }
              borderm.elemsize._0_4_ = 0;
              borderm.elemsize._4_4_ = 0;
              borderm.elempack = 0;
              borderm.data = (void *)0x0;
              borderm.refcount._0_4_ = 0;
              borderm.refcount._4_4_ = 0;
              borderm.dims = 0;
              borderm.w = 0;
              borderm.h = 0;
              borderm.c = 0;
              borderm.cstep = 0;
              piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    if (m.data != (void *)0x0) {
                      free(m.data);
                    }
                  }
                  else {
                    (**(code **)(*(long *)m.allocator + 0x18))();
                  }
                }
              }
              m.elemsize._0_4_ = 0;
              m.elemsize._4_4_ = 0;
              m.elempack = 0;
              m.data = (void *)0x0;
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.dims = 0;
              m.w = 0;
              m.h = 0;
              m.c = 0;
              m.cstep = 0;
              lVar8 = lVar8 + 1;
            } while (lVar8 < _outc);
          }
          iVar7 = 0;
        }
      }
      else {
        m.elemsize._0_4_ = 0;
        m.elemsize._4_4_ = 0;
        m.elempack = 0;
        m.data = (void *)0x0;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.allocator = (Allocator *)0x0;
        m.dims = 0;
        m.w = 0;
        m.h = 0;
        m.c = 0;
        m.cstep = 0;
        if ((bottom_blob->data != (void *)0x0) && (bottom_blob_sliced.cstep * (long)_outc != 0)) {
          Mat::create(&m,bottom_blob_sliced.w,bottom_blob_sliced.h,_outc,uVar6,
                      bottom_blob_sliced.elempack,(Allocator *)0x0);
          if ((long)bottom_blob_sliced.c * bottom_blob_sliced.cstep != 0) {
            memcpy(m.data,bottom_blob_sliced.data,
                   (long)bottom_blob_sliced.c * bottom_blob_sliced.cstep *
                   CONCAT44(bottom_blob_sliced.elemsize._4_4_,
                            (undefined4)bottom_blob_sliced.elemsize));
          }
        }
        if (&m != pMVar12) {
          piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = pMVar12->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (pMVar12->allocator == (Allocator *)0x0) {
                if (pMVar12->data != (void *)0x0) {
                  free(pMVar12->data);
                }
              }
              else {
                (**(code **)(*(long *)pMVar12->allocator + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&pMVar12->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar12->elemsize + 4) = 0;
          pMVar12->data = (void *)0x0;
          pMVar12->refcount = (int *)0x0;
          pMVar12->dims = 0;
          pMVar12->w = 0;
          pMVar12->h = 0;
          pMVar12->c = 0;
          pMVar12->cstep = 0;
          pMVar12->data = m.data;
          pMVar12->refcount = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          pMVar12->elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
          pMVar12->elempack = m.elempack;
          pMVar12->allocator = m.allocator;
          pMVar12->dims = m.dims;
          pMVar12->w = m.w;
          pMVar12->h = m.h;
          pMVar12->c = m.c;
          pMVar12->cstep = m.cstep;
        }
        piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (**(code **)(*(long *)m.allocator + 0x18))();
            }
          }
        }
        if (pMVar12->data == (void *)0x0) {
          iVar7 = -100;
        }
        else {
          iVar7 = -100;
          if ((long)pMVar12->c * pMVar12->cstep != 0) {
            iVar7 = 0;
          }
        }
      }
      piVar3 = (int *)CONCAT44(bottom_blob_sliced.refcount._4_4_,bottom_blob_sliced.refcount._0_4_);
      if (piVar3 == (int *)0x0) {
        return iVar7;
      }
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 != 0) {
        return iVar7;
      }
      if (bottom_blob_sliced.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)bottom_blob_sliced.allocator + 0x18))();
        return iVar7;
      }
      if (bottom_blob_sliced.data != (void *)0x0) {
        free(bottom_blob_sliced.data);
        return iVar7;
      }
      return iVar7;
    }
    if (local_130 == bottom_blob) {
      return 0;
    }
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = local_130->refcount;
    if (piVar3 == (int *)0x0) goto LAB_00136b0e;
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 != 0) goto LAB_00136b0e;
    pvVar13 = local_130->data;
    pAVar4 = local_130->allocator;
  }
  else if (iVar1 == 2) {
    if (iVar11 != _outh || iVar7 != _outw) {
      Mat::create(local_130,_outw,_outh,local_d0,opt->blob_allocator);
      if (pMVar12->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar12->c * pMVar12->cstep == 0) {
        return -100;
      }
      if (sVar10 == 4) {
        copy_cut_border_image<float>(bottom_blob,pMVar12,_hoffset,_woffset);
        return 0;
      }
      if (sVar10 != 2) {
        if (sVar10 != 1) {
          return 0;
        }
        copy_cut_border_image<signed_char>(bottom_blob,pMVar12,_hoffset,_woffset);
        return 0;
      }
      copy_cut_border_image<unsigned_short>(bottom_blob,pMVar12,_hoffset,_woffset);
      return 0;
    }
    if (local_130 == bottom_blob) {
      return 0;
    }
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = local_130->refcount;
    if (piVar3 == (int *)0x0) goto LAB_00136b0e;
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 != 0) goto LAB_00136b0e;
    pvVar13 = local_130->data;
    pAVar4 = local_130->allocator;
  }
  else {
    if (iVar1 != 1) {
      return 0;
    }
    if (_outw != iVar7) {
      Mat::create(local_130,_outw,local_d0,opt->blob_allocator);
      if (pMVar12->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar12->c * pMVar12->cstep == 0) {
        return -100;
      }
      if (sVar10 == 4) {
        copy_cut_border_image<float>(bottom_blob,pMVar12,0,_woffset);
        return 0;
      }
      if (sVar10 == 2) {
        copy_cut_border_image<unsigned_short>(bottom_blob,pMVar12,0,_woffset);
        return 0;
      }
      if (sVar10 == 1) {
        copy_cut_border_image<signed_char>(bottom_blob,pMVar12,0,_woffset);
        return 0;
      }
      return 0;
    }
    if (local_130 == bottom_blob) {
      return 0;
    }
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = local_130->refcount;
    if (piVar3 == (int *)0x0) goto LAB_00136b0e;
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 != 0) goto LAB_00136b0e;
    pvVar13 = local_130->data;
    pAVar4 = local_130->allocator;
  }
  if (pAVar4 == (Allocator *)0x0) {
    if (pvVar13 != (void *)0x0) {
      free(pvVar13);
    }
  }
  else {
    (**(code **)(*(long *)pAVar4 + 0x18))();
  }
LAB_00136b0e:
  *(undefined8 *)((long)&pMVar12->refcount + 4) = 0;
  *(undefined8 *)((long)&pMVar12->elemsize + 4) = 0;
  pMVar12->data = (void *)0x0;
  pMVar12->refcount = (int *)0x0;
  pMVar12->dims = 0;
  pMVar12->w = 0;
  pMVar12->h = 0;
  pMVar12->c = 0;
  pMVar12->cstep = 0;
  piVar3 = bottom_blob->refcount;
  pMVar12->data = bottom_blob->data;
  pMVar12->refcount = piVar3;
  pMVar12->elemsize = bottom_blob->elemsize;
  pMVar12->elempack = bottom_blob->elempack;
  pMVar12->allocator = bottom_blob->allocator;
  iVar7 = bottom_blob->w;
  iVar11 = bottom_blob->h;
  iVar1 = bottom_blob->c;
  pMVar12->dims = bottom_blob->dims;
  pMVar12->w = iVar7;
  pMVar12->h = iVar11;
  pMVar12->c = iVar1;
  pMVar12->cstep = bottom_blob->cstep;
  return 0;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset, _hoffset, _coffset;
    int _outw, _outh, _outc;
    resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _coffset, _outw, _outh, _outc);

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<_outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    return 0;
}